

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_dump.c
# Opt level: O0

int s98d_dump(s98context *ctx)

{
  uint uVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint local_50;
  int times;
  char part_name;
  uint8_t value;
  uint8_t addr;
  uint8_t *end_ptr;
  uint8_t *loop_ptr;
  uint8_t *tag_ptr;
  s98header *h;
  uint local_20;
  int line_chars;
  int current_ch;
  int ch;
  s98context *ctx_local;
  
  local_20 = 0xffffffff;
  h._4_4_ = 0;
  set_offset(ctx,(ulong)(ctx->header).offset_to_dump);
  puVar2 = ctx->s98_buffer;
  uVar1 = (ctx->header).offset_to_loop;
  _times = ctx->s98_buffer + ctx->s98_size;
  if (ctx->p < ctx->s98_buffer + (ctx->header).offset_to_tag) {
    _times = ctx->s98_buffer + (ctx->header).offset_to_tag;
  }
  while( true ) {
    if (ctx->p == puVar2 + uVar1) {
      printf("\n\n[\n");
      local_20 = 0xffffffff;
    }
    bVar3 = read_byte(ctx);
    uVar6 = (uint)bVar3;
    if (_times < ctx->p) break;
    if (uVar6 < 0x80) {
      bVar4 = read_byte(ctx);
      bVar5 = read_byte(ctx);
      if (local_20 != uVar6) {
        h._4_4_ = printf("\n%c ",(ulong)(uint)(int)(char)(bVar3 + 0x41));
        local_20 = uVar6;
      }
      if (0x4f < h._4_4_ + 6) {
        h._4_4_ = printf("\n%c ",(ulong)(local_20 + 0x41));
      }
      iVar7 = printf("%02x:%02x ",(ulong)bVar4,(ulong)bVar5);
      h._4_4_ = iVar7 + h._4_4_;
    }
    else {
      if (uVar6 == 0xfd) {
        printf("\n\n]\n");
      }
      else if (uVar6 == 0xfe) {
        if ((ctx->header).version == 1) {
          bVar3 = read_byte(ctx);
          local_50 = bVar3 + 2;
        }
        else {
          local_50 = getvv(ctx);
        }
        printf("\n\n/ %d",(ulong)local_50);
        step_timer(ctx,local_50);
        print_timestamp(ctx,_stdout);
        putchar(10);
      }
      else {
        if (uVar6 != 0xff) {
          return 1;
        }
        printf("\n\n/");
        step_timer(ctx,1);
        print_timestamp(ctx,_stdout);
        putchar(10);
      }
      local_20 = 0xffffffff;
    }
  }
  return 0;
}

Assistant:

int s98d_dump(struct s98context* ctx)
{
    int ch;
    int current_ch = -1;
    int line_chars = 0;
    struct s98header* h = &ctx->header;
    uint8_t* tag_ptr;
    uint8_t* loop_ptr;
    uint8_t* end_ptr;

    set_offset(ctx, h->offset_to_dump);
    tag_ptr = ctx->s98_buffer + h->offset_to_tag;
    loop_ptr = ctx->s98_buffer + h->offset_to_loop;
    end_ptr = ctx->s98_buffer + ctx->s98_size;
    if(ctx->p < tag_ptr)
        end_ptr = tag_ptr;

    for(;;) {
        if(ctx->p == loop_ptr) {
            printf("\n\n[\n");
            current_ch = -1;
        }
        ch = read_byte(ctx);

        if(ctx->p > end_ptr) {
            // fprintf(stderr, "end of dump reached\n");
            break;
        }

        if(ch < 0x80) {
            uint8_t addr, value;
            // register write
            addr = read_byte(ctx);
            value = read_byte(ctx);

            if(current_ch != ch) {
                char part_name = ch + 'A';
                line_chars = printf("\n%c ", part_name);
                current_ch = ch;
            }
            if(line_chars + 6 >= 80) {
                line_chars = printf("\n%c ", current_ch + 'A');
            }
            line_chars += printf("%02x:%02x ", addr, value);
            continue;
        }
        switch(ch) {
        case 0xfd:
            printf("\n\n]\n");
            current_ch = -1;
            break;
        case 0xfe:
        {
            int times = 0;
            if(h->version == 1) {
                times = read_byte(ctx) + 2;
            } else {
                times = getvv(ctx);
            }
            printf("\n\n/ %d", times);
            step_timer(ctx, times);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        }
        case 0xff:
            printf("\n\n/");
            step_timer(ctx, 1);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        default:
            // 80-fc
            return 1;
        }
    }

    return 0;
}